

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_internal.h
# Opt level: O0

void ImPlot::CalculateBins<float>
               (float *values,int count,ImPlotBin meth,ImPlotRange *range,int *bins_out,
               double *width_out)

{
  __type _Var1;
  double dVar2;
  double *width_out_local;
  int *bins_out_local;
  ImPlotRange *range_local;
  ImPlotBin meth_local;
  int count_local;
  float *values_local;
  
  switch(meth) {
  case -4:
    dVar2 = ImStdDev<float>(values,count);
    _Var1 = std::cbrt<int>(count);
    *width_out = (dVar2 * 3.49) / _Var1;
    dVar2 = ImPlotRange::Size(range);
    dVar2 = round(dVar2 / *width_out);
    *bins_out = (int)dVar2;
    break;
  case -3:
    _Var1 = std::cbrt<int>(count);
    dVar2 = ceil(_Var1 * 2.0);
    *bins_out = (int)dVar2;
    break;
  case -2:
    _Var1 = std::log2<int>(count);
    dVar2 = ceil(_Var1 + 1.0);
    *bins_out = (int)dVar2;
    break;
  case -1:
    _Var1 = std::sqrt<int>(count);
    dVar2 = ceil(_Var1);
    *bins_out = (int)dVar2;
  }
  dVar2 = ImPlotRange::Size(range);
  *width_out = dVar2 / (double)*bins_out;
  return;
}

Assistant:

static inline void CalculateBins(const T* values, int count, ImPlotBin meth, const ImPlotRange& range, int& bins_out, double& width_out) {
    switch (meth) {
        case ImPlotBin_Sqrt:
            bins_out  = (int)ceil(sqrt(count));
            break;
        case ImPlotBin_Sturges:
            bins_out  = (int)ceil(1.0 + log2(count));
            break;
        case ImPlotBin_Rice:
            bins_out  = (int)ceil(2 * cbrt(count));
            break;
        case ImPlotBin_Scott:
            width_out = 3.49 * ImStdDev(values, count) / cbrt(count);
            bins_out  = (int)round(range.Size() / width_out);
            break;
    }
    width_out = range.Size() / bins_out;
}